

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * pack17_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x20000 | uVar1 - base;
  uVar2 = in[1] - base >> 0xf;
  out[1] = uVar2;
  uVar2 = (in[2] - base) * 4 | uVar2;
  out[1] = uVar2;
  out[1] = (in[3] - base) * 0x80000 | uVar2;
  uVar2 = in[3] - base >> 0xd;
  out[2] = uVar2;
  uVar2 = (in[4] - base) * 0x10 | uVar2;
  out[2] = uVar2;
  out[2] = (in[5] - base) * 0x200000 | uVar2;
  uVar2 = in[5] - base >> 0xb;
  out[3] = uVar2;
  uVar2 = (in[6] - base) * 0x40 | uVar2;
  out[3] = uVar2;
  out[3] = (in[7] - base) * 0x800000 | uVar2;
  out[4] = in[7] - base >> 9;
  return out + 5;
}

Assistant:

uint32_t * pack17_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  8 );
    ++in;

    return out + 1;
}